

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QCalendarPopup::mousePressEvent(QCalendarPopup *this,QMouseEvent *event)

{
  QWidgetData *pQVar1;
  char cVar2;
  QWidget *widget;
  QStyle *pQVar3;
  QPoint QVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  QStyleOptionComboBox opt;
  ulong local_f8;
  QPoint local_f0;
  undefined8 local_e8;
  ulong local_e0;
  QPoint local_d8;
  undefined8 uStack_d0;
  QStyleOptionComboBox local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  widget = (QWidget *)QMetaObject::cast((QObject *)&QDateTimeEdit::staticMetaObject);
  if (widget == (QWidget *)0x0) goto LAB_003f1588;
  memset(&local_c8,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(&local_c8);
  QStyleOption::initFrom((QStyleOption *)&local_c8,widget);
  local_d8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  uStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QWidget::style(widget);
  auVar11 = (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,&local_c8,4,widget);
  uStack_d0 = auVar11._8_8_;
  local_f0 = auVar11._0_8_;
  local_d8 = local_f0;
  QVar4 = QWidget::mapToGlobal(widget,&local_f0);
  iVar6 = QVar4.yp.m_i.m_i - local_d8.yp.m_i;
  uStack_d0 = (undefined1 *)
              CONCAT44(uStack_d0._4_4_ + iVar6,(int)uStack_d0 + (QVar4.xp.m_i.m_i - local_d8.xp.m_i)
                      );
  local_d8 = QVar4;
  auVar12 = QEventPoint::globalPosition();
  auVar11._0_8_ =
       (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar12._8_8_;
  auVar11._8_8_ =
       (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar12._0_8_;
  auVar11 = minpd(_DAT_0066f5d0,auVar11);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
  uVar7 = movmskpd(iVar6,auVar12);
  local_e0 = (ulong)(uint)(int)auVar11._8_8_;
  uVar5 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
  if ((uVar7 & 1) == 0) {
    uVar5 = 0x8000000000000000;
  }
  if ((uVar7 & 2) == 0) {
    local_e0 = 0x80000000;
  }
  local_e0 = local_e0 | uVar5;
  cVar2 = QRect::contains(&local_d8,SUB81(&local_e0,0));
  if (cVar2 == '\0') {
    pQVar1 = (this->super_QWidget).data;
    uVar8 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                     (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_f0.xp.m_i = 0;
    local_f0.yp.m_i = 0;
    local_e8 = uVar8;
    auVar11 = QEventPoint::position();
    auVar9._0_8_ = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar11._8_8_;
    auVar9._8_8_ = (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar11._0_8_;
    auVar11 = minpd(_DAT_0066f5d0,auVar9);
    auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
    auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
    uVar7 = movmskpd((int)uVar8,auVar10);
    uVar5 = 0x8000000000000000;
    if ((uVar7 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
    }
    local_f8 = 0x80000000;
    if ((uVar7 & 2) != 0) {
      local_f8 = (ulong)(uint)(int)auVar11._8_8_;
    }
    local_f8 = local_f8 | uVar5;
    cVar2 = QRect::contains(&local_f0,SUB81(&local_f8,0));
    if (cVar2 != '\0') goto LAB_003f1537;
  }
  else {
LAB_003f1537:
    QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
  }
  QIcon::~QIcon(&local_c8.currentIcon);
  if (&(local_c8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_c8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_c8.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_c8);
LAB_003f1588:
  QWidget::mousePressEvent(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::mousePressEvent(QMouseEvent *event)
{
    QDateTimeEdit *dateTime = qobject_cast<QDateTimeEdit *>(parentWidget());
    if (dateTime) {
        QStyleOptionComboBox opt;
        opt.initFrom(dateTime);
        QRect arrowRect = dateTime->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                            QStyle::SC_ComboBoxArrow, dateTime);
        arrowRect.moveTo(dateTime->mapToGlobal(arrowRect .topLeft()));
        if (arrowRect.contains(event->globalPosition().toPoint()) || rect().contains(event->position().toPoint()))
            setAttribute(Qt::WA_NoMouseReplay);
    }
    QWidget::mousePressEvent(event);
}